

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.cpp
# Opt level: O0

int main(void)

{
  reference this;
  rt_expr<viennamath::rt_expression_interface<double>> *prVar1;
  size_type num;
  ostream *poVar2;
  rt_expr<viennamath::rt_expression_interface<double>_> local_348;
  expr substi2;
  expr substi1;
  rt_expr<viennamath::rt_expression_interface<double>_> local_318;
  expr uv;
  expr vec_expr;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_300;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_2e0;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_2c0;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_2a0;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_280;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_260;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_240;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_220;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_200;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> local_1e0;
  self_type local_1c0;
  self_type local_1a0;
  undefined1 local_180 [8];
  vector_expr vec3;
  vector_expr vec2;
  vector_expr vec;
  type local_100;
  type local_e0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_c0;
  expr x_pow_4;
  undefined1 local_b0 [8];
  function_symbol v;
  undefined1 local_90 [8];
  function_symbol u;
  undefined1 local_70 [7];
  ct_constant<8L> c8;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable z;
  undefined1 local_30 [8];
  variable y;
  variable x;
  
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,0);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,1);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s,2);
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,4.0);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,6);
  viennamath::ct_constant<8L>::ct_constant((ct_constant<8L> *)((long)&u.tag_id_ + 7));
  viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>>::
  rt_function_symbol<viennamath::unknown_tag<0ul>>
            ((rt_function_symbol<viennamath::rt_expression_interface<double>> *)local_90,0,
             (unknown_tag<0UL> *)((long)&v.tag_id_ + 7));
  viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>>::
  rt_function_symbol<viennamath::test_tag<0ul>>
            ((rt_function_symbol<viennamath::rt_expression_interface<double>> *)local_b0,0,
             (test_tag<0UL> *)((long)&x_pow_4.rt_expr_._M_ptr + 7));
  viennamath::operator*
            (&local_100,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  viennamath::operator*
            ((type *)&vec.
                      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                      .
                      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  viennamath::operator*
            (&local_e0,&local_100,
             (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
             &vec.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_c0,&local_e0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_e0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
             &vec.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_100);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
  this = std::
         vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
         ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                       *)&vec,0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            (this,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  prVar1 = (rt_expr<viennamath::rt_expression_interface<double>> *)
           std::
           vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         *)&vec,1);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            (prVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  num = std::
        vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
        ::size((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                *)&vec2);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_180,num);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator=
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_180,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  prVar1 = (rt_expr<viennamath::rt_expression_interface<double>> *)
           std::
           vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         *)&vec2,1);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            (prVar1,(ct_constant<8L> *)((long)&u.tag_id_ + 7));
  prVar1 = (rt_expr<viennamath::rt_expression_interface<double>> *)
           std::
           vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ::operator[]((vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         *)&vec2,2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            (prVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec: ");
  poVar2 = viennamath::operator<<
                     (poVar2,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &vec2.
                              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              .
                              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2: ");
  poVar2 = viennamath::operator<<
                     (poVar2,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &vec3.
                              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              .
                              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec3: ");
  poVar2 = viennamath::operator<<
                     (poVar2,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             local_180);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"----------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec + vec2: ");
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator+
            (&local_1a0,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (self_type *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_1a0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_1a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec - vec2: ");
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
            (&local_1c0,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (self_type *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_1c0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_1c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"z * vec2: ");
  viennamath::operator*
            (&local_1e0,(rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_1e0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_1e0);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2 * z: ");
  viennamath::operator*
            (&local_200,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s);
  poVar2 = viennamath::operator<<(poVar2,&local_200);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_200);
  poVar2 = std::operator<<((ostream *)&std::cout,"c4 * vec2: ");
  viennamath::operator*
            (&local_220,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_220);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_220);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2 * c4: ");
  viennamath::operator*
            (&local_240,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  poVar2 = viennamath::operator<<(poVar2,&local_240);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_240);
  poVar2 = std::operator<<((ostream *)&std::cout,"c6 * vec2: ");
  viennamath::operator*
            (&local_260,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_260);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_260);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2 * c6: ");
  viennamath::operator*
            (&local_280,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  poVar2 = viennamath::operator<<(poVar2,&local_280);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_280);
  poVar2 = std::operator<<((ostream *)&std::cout,"c6 * vec2: ");
  viennamath::operator*
            (&local_2a0,(ct_constant<8L> *)((long)&u.tag_id_ + 7),
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_2a0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_2a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2 * c6: ");
  viennamath::operator*
            (&local_2c0,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ct_constant<8L> *)((long)&u.tag_id_ + 7));
  poVar2 = viennamath::operator<<(poVar2,&local_2c0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_2c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"c6 / vec2: ");
  viennamath::operator/
            (&local_2e0,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&local_2e0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_2e0);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec2 / z: ");
  viennamath::operator/
            (&local_300,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  poVar2 = viennamath::operator<<(poVar2,&local_300);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            (&local_300);
  poVar2 = std::operator<<((ostream *)&std::cout,"----------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec * vec2: ");
  viennamath::operator*
            ((viennamath *)&vec_expr,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = viennamath::operator<<(poVar2,&vec_expr);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&vec_expr);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&uv,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                 &vec2.
                  super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  .
                  super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<((ostream *)&std::cout,"vec as expr: ");
  poVar2 = viennamath::operator<<(poVar2,&uv);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::operator*
            ((type *)&substi1,
             (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_90,
             (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_b0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&local_318,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&substi1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&substi1);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&substi2,
             (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_90,&uv,
             &local_318);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&local_348,
             (rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_b0,&uv,
             &substi2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Substituted 1: ");
  poVar2 = viennamath::operator<<(poVar2,&substi2);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Substituted 2: ");
  poVar2 = viennamath::operator<<(poVar2,&local_348);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_348);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&substi2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_318);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&uv);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)local_180);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec3.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::~rt_vector_expr
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
             &vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_c0);
  viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::~rt_function_symbol
            ((rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_b0);
  viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::~rt_function_symbol
            ((rt_function_symbol<viennamath::rt_expression_interface<double>_> *)local_90);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::~rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::function_symbol u(0, viennamath::unknown_tag<>());
  viennamath::function_symbol v(0, viennamath::test_tag<>());
  viennamath::expr x_pow_4 = (x*x)*(x*x);

  viennamath::vector_expr  vec(3);
  vec[0] = x;
  //vec[1] = c6;             //uncomment this is you do not want to have the default constant '0' here
  //vec[2] = x*y + z - c6;   //uncomment this is you do not want to have the default constant '0' here

  viennamath::vector_expr  vec2(vec);
  vec[1] = c6;

  viennamath::vector_expr  vec3(vec2.size());
  vec3 = vec2;
  vec2[1] = c8;
  vec2[2] = c6;

  std::cout << "vec: " << vec << std::endl;
  std::cout << "vec2: " << vec2 << std::endl;
  std::cout << "vec3: " << vec3 << std::endl;
  std::cout << "----------------------" << std::endl;
  std::cout << "vec + vec2: " << vec + vec2 << std::endl;
  std::cout << "vec - vec2: " << vec - vec2 << std::endl;

  // check multiplication:
  std::cout << "z * vec2: "   << z * vec2   << std::endl;
  std::cout << "vec2 * z: "   << vec2 * z   << std::endl;

  std::cout << "c4 * vec2: "   << c4 * vec2   << std::endl;
  std::cout << "vec2 * c4: "   << vec2 * c4   << std::endl;

  std::cout << "c6 * vec2: "   << c6 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c6   << std::endl;

  std::cout << "c6 * vec2: "   << c8 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c8   << std::endl;

  // check division:
  std::cout << "c6 / vec2: "  << c6 / vec2  << std::endl;
  std::cout << "vec2 / z: "   << vec2 / c6  << std::endl;


  std::cout << "----------------------" << std::endl;
  std::cout << "vec * vec2: "   << vec * vec2  << std::endl;

  viennamath::expr vec_expr = vec;
  std::cout << "vec as expr: " << vec_expr << std::endl;


  viennamath::expr uv = u*v;
  viennamath::expr substi1 = viennamath::substitute(u, vec_expr, uv);
  viennamath::expr substi2 = viennamath::substitute(v, vec_expr, substi1);
  std::cout << "Substituted 1: " << substi1 << std::endl;
  std::cout << "Substituted 2: " << substi2 << std::endl;


  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}